

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestraintStamp.cpp
# Opt level: O2

void __thiscall OpenMD::RestraintStamp::validate(RestraintStamp *this)

{
  pointer pcVar1;
  bool bVar2;
  allocator<char> local_221;
  double local_220;
  allocator<char> local_211;
  EqualIgnoreCaseConstraint local_210;
  OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint> local_1d0;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  EqualIgnoreCaseConstraint local_b0;
  string local_70;
  undefined8 local_50 [4];
  
  DataHolder::validate(&this->super_DataHolder);
  if ((this->Type).super_ParameterBase.empty_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Object",(allocator<char> *)local_50);
    isEqualIgnoreCase(&local_210,&local_70);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"Molecular",&local_221);
    isEqualIgnoreCase(&local_b0,&local_d0);
    OpenMD::operator||(&local_1d0,
                       &local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>,
                       &local_b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    std::__cxx11::string::string((string *)&local_f0,(string *)&(this->Type).data_);
    bVar2 = OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>::
            operator()((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_1d0,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint(&local_1d0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_210);
    std::__cxx11::string::~string((string *)&local_70);
    if (!bVar2) {
      pcVar1 = (this->Type).super_ParameterBase.keyword_._M_dataplus._M_p;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"Object",&local_221);
      isEqualIgnoreCase(&local_210,&local_110);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"Molecular",&local_211);
      isEqualIgnoreCase(&local_b0,&local_130);
      OpenMD::operator||(&local_1d0,
                         &local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>,
                         &local_b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
      std::__cxx11::string::string((string *)local_50,(string *)&local_1d0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar1,local_50[0]);
      std::__cxx11::string::~string((string *)local_50);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint(&local_1d0);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_b0);
      std::__cxx11::string::~string((string *)&local_130);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_210);
      std::__cxx11::string::~string((string *)&local_110);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->DisplacementSpringConstant).super_ParameterBase.empty_ == false) {
    isNonNegative();
    local_220 = (this->DisplacementSpringConstant).data_;
    std::__cxx11::string::~string((string *)&local_1d0);
    if (local_220 < 0.0) {
      pcVar1 = (this->DisplacementSpringConstant).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNonNegative();
      std::__cxx11::string::string((string *)&local_1d0,(string *)&local_210);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar1,
               local_1d0.
               super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
               .description_._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_210);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->AbsoluteSpringConstant).super_ParameterBase.empty_ == false) {
    isNonNegative();
    local_220 = (this->AbsoluteSpringConstant).data_;
    std::__cxx11::string::~string((string *)&local_1d0);
    if (local_220 < 0.0) {
      pcVar1 = (this->AbsoluteSpringConstant).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNonNegative();
      std::__cxx11::string::string((string *)&local_1d0,(string *)&local_210);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar1,
               local_1d0.
               super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
               .description_._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_210);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->TwistSpringConstant).super_ParameterBase.empty_ == false) {
    isNonNegative();
    local_220 = (this->TwistSpringConstant).data_;
    std::__cxx11::string::~string((string *)&local_1d0);
    if (local_220 < 0.0) {
      pcVar1 = (this->TwistSpringConstant).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNonNegative();
      std::__cxx11::string::string((string *)&local_1d0,(string *)&local_210);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar1,
               local_1d0.
               super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
               .description_._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_210);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->SwingXSpringConstant).super_ParameterBase.empty_ == false) {
    isNonNegative();
    local_220 = (this->SwingXSpringConstant).data_;
    std::__cxx11::string::~string((string *)&local_1d0);
    if (local_220 < 0.0) {
      pcVar1 = (this->SwingXSpringConstant).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNonNegative();
      std::__cxx11::string::string((string *)&local_1d0,(string *)&local_210);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar1,
               local_1d0.
               super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
               .description_._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_210);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->SwingYSpringConstant).super_ParameterBase.empty_ == false) {
    isNonNegative();
    local_220 = (this->SwingYSpringConstant).data_;
    std::__cxx11::string::~string((string *)&local_1d0);
    if (local_220 < 0.0) {
      pcVar1 = (this->SwingYSpringConstant).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNonNegative();
      std::__cxx11::string::string((string *)&local_1d0,(string *)&local_210);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar1,
               local_1d0.
               super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
               .description_._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_210);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  return;
}

Assistant:

void RestraintStamp::validate() {
    DataHolder::validate();
    CheckParameter(
        Type, isEqualIgnoreCase("Object") || isEqualIgnoreCase("Molecular"));
    CheckParameter(DisplacementSpringConstant, isNonNegative());
    CheckParameter(AbsoluteSpringConstant, isNonNegative());
    CheckParameter(TwistSpringConstant, isNonNegative());
    CheckParameter(SwingXSpringConstant, isNonNegative());
    CheckParameter(SwingYSpringConstant, isNonNegative());
    // CheckParameter(MolIndex, isNonNegative());
  }